

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

ostream * __thiscall smf::Options::printOptionList(Options *this,ostream *out)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  _Self __tmp;
  
  for (p_Var2 = (this->m_optionList)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_optionList)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<(out,(string *)(p_Var2 + 1));
    poVar1 = std::operator<<(poVar1,"\t");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,p_Var2[2]._M_color);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return out;
}

Assistant:

std::ostream& Options::printOptionList(std::ostream& out) {
   for (auto it = m_optionList.begin(); it != m_optionList.end(); it++) {
      out << it->first << "\t" << it->second << std::endl;
   }
   return out;
}